

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.cpp
# Opt level: O2

void __thiscall
vera::PingPong::allocate
          (PingPong *this,int _width,int _height,FboType _type,TextureFilter _filter,
          TextureWrap _wrap,bool _autoclear)

{
  long lVar1;
  
  for (lVar1 = 0x18; lVar1 != 0x88; lVar1 = lVar1 + 0x38) {
    (**(code **)(*(long *)((long)&this->_vptr_PingPong + lVar1) + 0x10))
              ((long)&this->_vptr_PingPong + lVar1,_width,_height,_type,_filter,_wrap,_autoclear);
  }
  (*this->_vptr_PingPong[4])(0,this);
  this->m_flag = 0;
  (*this->_vptr_PingPong[3])(this);
  return;
}

Assistant:

void PingPong::allocate(int _width, int _height, FboType _type, TextureFilter _filter, TextureWrap _wrap, bool _autoclear) {
    for(int i = 0; i < 2; i++)
        m_fbos[i].allocate(_width, _height, _type, _filter, _wrap, _autoclear);

    clear();

    // Set everything to 0
    m_flag = 0;
    swap();
}